

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_handle_directive(Parser *this,csubstr directive_)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  NodeType NVar4;
  NodeData *pNVar5;
  size_t sVar6;
  ro_substr pattern;
  csubstr fmt;
  csubstr fmt_00;
  ro_substr pattern_00;
  basic_substring<const_char> local_78;
  basic_substring<const_char> local_68;
  csubstr directive__local;
  TagDirective local_48;
  
  directive__local.len = directive_.len;
  directive__local.str = directive_.str;
  pattern.len = 4;
  pattern.str = "%TAG";
  local_78.str = directive__local.str;
  local_78.len = directive__local.len;
  bVar2 = basic_substring<const_char>::begins_with(&local_78,pattern);
  if (bVar2) {
    local_48.prefix.str = (char *)0x0;
    local_48.prefix.len = 0;
    local_48.handle.str = (char *)0x0;
    local_48.handle.len = 0;
    if (local_78.len < 4) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring(&local_68,local_78.str + 4,local_78.len - 4);
    if ((local_68.len == 0) || (*local_68.str != ' ')) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      fmt.len = 0x22;
      fmt.str = "ERROR: malformed tag directive: {}";
      _err<c4::basic_substring<char_const>>(this,fmt,&directive__local);
    }
    local_78 = basic_substring<const_char>::triml(&local_78,' ');
    sVar3 = basic_substring<const_char>::first_of(&local_78,' ',0);
    if (sVar3 == 0xffffffffffffffff) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      fmt_00.len = 0x22;
      fmt_00.str = "ERROR: malformed tag directive: {}";
      _err<c4::basic_substring<char_const>>(this,fmt_00,&directive__local);
    }
    if (sVar3 != 0xffffffffffffffff && local_78.len < sVar3) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x154e,"num <= len || num == npos");
    }
    sVar6 = local_78.len;
    if (sVar3 != 0xffffffffffffffff) {
      sVar6 = sVar3;
    }
    basic_substring<const_char>::basic_substring(&local_68,local_78.str,sVar6);
    local_48.handle.str = local_68.str;
    local_48.handle.len = local_68.len;
    if (local_78.len < local_68.len) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar2 = is_debugger_attached();
        if (bVar2) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
      }
      handle_error(0x1e7ac6,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (&local_68,local_78.str + local_68.len,local_78.len - local_68.len);
    local_78 = basic_substring<const_char>::triml(&local_68,' ');
    sVar3 = basic_substring<const_char>::first_of(&local_78,' ',0);
    if (sVar3 != 0xffffffffffffffff) {
      if (local_78.len < sVar3) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar2 = is_debugger_attached();
          if (bVar2) {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
        }
        handle_error(0x1e7ac6,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x154e,"num <= len || num == npos");
      }
      basic_substring<const_char>::basic_substring(&local_68,local_78.str,sVar3);
      local_78.len = local_68.len;
      local_78.str = local_68.str;
    }
    local_48.prefix.str = local_78.str;
    local_48.prefix.len = local_78.len;
    sVar3 = this->m_tree->m_size;
    local_48.next_node_id = sVar3;
    if (sVar3 != 0) {
      sVar6 = sVar3 - 1;
      bVar2 = Tree::is_root(this->m_tree,sVar6);
      if (bVar2) {
        NVar4 = Tree::type(this->m_tree,sVar6);
        if (NVar4.type != NOTYPE) {
          pNVar5 = Tree::_p(this->m_tree,sVar6);
          if ((~(int)(pNVar5->m_type).type & 0x28U) != 0) {
            local_48.next_node_id = sVar3 + 1;
          }
        }
      }
    }
    Tree::add_tag_directive(this->m_tree,&local_48);
  }
  else {
    pattern_00.len = 5;
    pattern_00.str = "%YAML";
    basic_substring<const_char>::begins_with(&local_78,pattern_00);
  }
  return;
}

Assistant:

void Parser::_handle_directive(csubstr directive_)
{
    csubstr directive = directive_;
    if(directive.begins_with("%TAG"))
    {
        TagDirective td;
        _c4dbgpf("%TAG directive: {}", directive_);
        directive = directive.sub(4);
        if(!directive.begins_with(' '))
            _c4err("malformed tag directive: {}", directive_);
        directive = directive.triml(' ');
        size_t pos = directive.find(' ');
        if(pos == npos)
            _c4err("malformed tag directive: {}", directive_);
        td.handle = directive.first(pos);
        directive = directive.sub(td.handle.len).triml(' ');
        pos = directive.find(' ');
        if(pos != npos)
            directive = directive.first(pos);
        td.prefix = directive;
        td.next_node_id = m_tree->size();
        if(m_tree->size() > 0)
        {
            size_t prev = m_tree->size() - 1;
            if(m_tree->is_root(prev) && m_tree->type(prev) != NOTYPE && !m_tree->is_stream(prev))
                ++td.next_node_id;
        }
        _c4dbgpf("%TAG: handle={} prefix={} next_node={}", td.handle, td.prefix, td.next_node_id);
        m_tree->add_tag_directive(td);
    }
    else if(directive.begins_with("%YAML"))
    {
        _c4dbgpf("%YAML directive! ignoring...: {}", directive);
    }
}